

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformsurface.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QPlatformSurface *surface)

{
  long lVar1;
  QSurface *this;
  _func_int **pp_Var2;
  SurfaceClass SVar3;
  QDebug *pQVar4;
  void *in_RDX;
  long in_FS_OFFSET;
  Stream *local_70;
  undefined1 local_68 [8];
  QDebug local_60;
  undefined1 local_58 [8];
  QDebug local_50;
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)surface);
  *(undefined1 *)(surface->_vptr_QPlatformSurface + 6) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)surface,"QPlatformSurface(");
  QDebug::operator<<(pQVar4,in_RDX);
  if (in_RDX != (void *)0x0) {
    this = *(QSurface **)((long)in_RDX + 8);
    SVar3 = QSurface::surfaceClass(this);
    pQVar4 = QDebug::operator<<((QDebug *)surface,", class=");
    local_50.stream = pQVar4->stream;
    (local_50.stream)->ref = (local_50.stream)->ref + 1;
    operator<<((Stream *)local_48,(SurfaceClass)&local_50);
    QDebug::~QDebug((QDebug *)local_48);
    QDebug::~QDebug(&local_50);
    pQVar4 = QDebug::operator<<((QDebug *)surface,", type=");
    local_60.stream = pQVar4->stream;
    (local_60.stream)->ref = (local_60.stream)->ref + 1;
    (*this->_vptr_QSurface[4])(this);
    operator<<((Stream *)local_58,(SurfaceType)&local_60);
    QDebug::~QDebug((QDebug *)local_58);
    QDebug::~QDebug(&local_60);
    if (SVar3 == Window) {
      pQVar4 = QDebug::operator<<((QDebug *)surface,", window=");
      local_70 = pQVar4->stream;
      local_70->ref = local_70->ref + 1;
      operator<<((Stream *)local_68,(QWindow *)&local_70);
      QDebug::~QDebug((QDebug *)local_68);
      QDebug::~QDebug((QDebug *)&local_70);
    }
    else {
      pQVar4 = QDebug::operator<<((QDebug *)surface,", surface=");
      QDebug::operator<<(pQVar4,this);
    }
  }
  QDebug::operator<<((QDebug *)surface,')');
  pp_Var2 = surface->_vptr_QPlatformSurface;
  surface->_vptr_QPlatformSurface = (_func_int **)0x0;
  *(_func_int ***)debug.stream = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug debug, const QPlatformSurface *surface)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug << "QPlatformSurface(" << (const void *)surface;
    if (surface) {
        QSurface *s = surface->surface();
        auto surfaceClass = s->surfaceClass();
        debug << ", class=" << surfaceClass;
        debug << ", type=" << s->surfaceType();
        if (surfaceClass == QSurface::Window)
            debug << ", window=" << static_cast<QWindow *>(s);
        else
            debug << ", surface=" << s;
    }
    debug << ')';
    return debug;
}